

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

void Curl_all_content_encodings(char *buf,size_t blen)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  Curl_cwtype *pCVar4;
  ulong uVar5;
  Curl_cwtype **ppCVar6;
  
  *buf = '\0';
  pCVar4 = &identity_encoding;
  ppCVar6 = general_unencoders;
  uVar5 = 0;
  do {
    ppCVar6 = ppCVar6 + 1;
    iVar1 = curl_strequal(pCVar4->name,"identity");
    if (iVar1 == 0) {
      sVar2 = strlen(pCVar4->name);
      uVar5 = uVar5 + sVar2 + 2;
    }
    pCVar4 = *ppCVar6;
  } while (pCVar4 != (Curl_cwtype *)0x0);
  if (uVar5 == 0) {
    if (8 < blen) {
      builtin_strncpy(buf,"identity",9);
    }
  }
  else if (uVar5 < blen) {
    pCVar4 = &identity_encoding;
    ppCVar6 = general_unencoders;
    do {
      ppCVar6 = ppCVar6 + 1;
      iVar1 = curl_strequal(pCVar4->name,"identity");
      if (iVar1 == 0) {
        strcpy(buf,pCVar4->name);
        sVar2 = strlen(buf);
        pcVar3 = buf + sVar2;
        buf = pcVar3 + 2;
        pcVar3[0] = ',';
        pcVar3[1] = ' ';
      }
      pCVar4 = *ppCVar6;
    } while (pCVar4 != (Curl_cwtype *)0x0);
    buf[-2] = '\0';
  }
  return;
}

Assistant:

void Curl_all_content_encodings(char *buf, size_t blen)
{
  size_t len = 0;
  const struct Curl_cwtype * const *cep;
  const struct Curl_cwtype *ce;

  DEBUGASSERT(buf);
  DEBUGASSERT(blen);
  buf[0] = 0;

  for(cep = general_unencoders; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len) {
    if(blen >= sizeof(CONTENT_ENCODING_DEFAULT))
      strcpy(buf, CONTENT_ENCODING_DEFAULT);
  }
  else if(blen > len) {
    char *p = buf;
    for(cep = general_unencoders; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }
}